

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbifnet.cpp
# Opt level: O0

void __thiscall HttpReqThread::~HttpReqThread(HttpReqThread *this)

{
  _func_int **pp_Var1;
  OS_Thread *in_RDI;
  CVmObjTable *unaff_retaddr;
  OS_Thread *var;
  
  (in_RDI->super_CVmWeakRefable).super_CVmRefCntObj._vptr_CVmRefCntObj =
       (_func_int **)&PTR__HttpReqThread_0042b718;
  (in_RDI->super_OS_Waitable)._vptr_OS_Waitable = (_func_int **)&DAT_0042b748;
  var = in_RDI;
  lib_free_str((char *)0x252d81);
  lib_free_str((char *)0x252d91);
  lib_free_str((char *)0x252da1);
  lib_free_str((char *)0x252db1);
  if ((in_RDI[2].super_CVmWeakRefable.super_CVmRefCntObj._vptr_CVmRefCntObj != (_func_int **)0x0) &&
     (pp_Var1 = in_RDI[2].super_CVmWeakRefable.super_CVmRefCntObj._vptr_CVmRefCntObj,
     pp_Var1 != (_func_int **)0x0)) {
    OS_HttpPayload::~OS_HttpPayload((OS_HttpPayload *)unaff_retaddr);
    operator_delete(pp_Var1,0x10);
  }
  if (in_RDI[1].super_CVmWeakRefable.super_CVmRefCntObj.cnt.cnt.super___atomic_base<long>._M_i != 0)
  {
    CVmRefCntObj::release_ref((CVmRefCntObj *)in_RDI);
  }
  if (in_RDI[2].super_CVmWeakRefable.super_CVmRefCntObj.cnt.cnt.super___atomic_base<long>._M_i != 0)
  {
    CVmObjTable::delete_global_var(unaff_retaddr,(vm_globalvar_t *)var);
  }
  OS_Thread::~OS_Thread(in_RDI);
  return;
}

Assistant:

~HttpReqThread()
    {
        /* establish the global context */
        VMGLOB_PTR(vmg);

        /* delete copied strings */
        lib_free_str(host);
        lib_free_str(resource);
        lib_free_str(verb);
        lib_free_str(hdrs);

        /* delete the content body */
        if (body != 0)
            delete body;

        /* release the message queue */
        if (queue != 0)
            queue->release_ref();

        /* delete our ID global, if we still own it */
        if (idg != 0)
            G_obj_table->delete_global_var(idg);

    }